

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

void us_socket_context_on_open
               (int ssl,us_socket_context_t *context,
               _func_us_socket_t_ptr_us_socket_t_ptr_int_char_ptr_int *on_open)

{
  _func_us_internal_ssl_socket_t_ptr_us_internal_ssl_socket_t_ptr_int_char_ptr_int *in_RDX;
  us_internal_ssl_socket_context_t *in_RSI;
  int in_EDI;
  
  if (in_EDI == 0) {
    (in_RSI->sc).on_open = (_func_us_socket_t_ptr_us_socket_t_ptr_int_char_ptr_int *)in_RDX;
  }
  else {
    us_internal_ssl_socket_context_on_open(in_RSI,in_RDX);
  }
  return;
}

Assistant:

void us_socket_context_on_open(int ssl, struct us_socket_context_t *context, struct us_socket_t *(*on_open)(struct us_socket_t *s, int is_client, char *ip, int ip_length)) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        us_internal_ssl_socket_context_on_open((struct us_internal_ssl_socket_context_t *) context, (struct us_internal_ssl_socket_t * (*)(struct us_internal_ssl_socket_t *, int,  char *, int)) on_open);
        return;
    }
#endif

    context->on_open = on_open;
}